

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O1

bool draco::ReadFileToString(string *file_name,string *contents)

{
  pointer pcVar1;
  bool bVar2;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  file_reader;
  vector<char,_std::allocator<char>_> buffer;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  
  if (contents == (string *)0x0) {
    bVar2 = false;
  }
  else {
    FileReaderFactory::OpenReader((string *)local_40);
    if ((long *)local_40._0_8_ == (long *)0x0) {
      bVar2 = false;
    }
    else {
      local_40._8_8_ = (void *)0x0;
      aStack_30._M_allocated_capacity = 0;
      aStack_30._8_8_ = 0;
      bVar2 = ReadFileToBuffer(file_name,(vector<char,_std::allocator<char>_> *)(local_40 + 8));
      if (bVar2) {
        pcVar1 = (contents->_M_dataplus)._M_p;
        std::__cxx11::string::
        _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)contents,pcVar1,pcVar1 + contents->_M_string_length,local_40._8_8_,
                   aStack_30._M_allocated_capacity);
      }
      if ((void *)local_40._8_8_ != (void *)0x0) {
        operator_delete((void *)local_40._8_8_,aStack_30._8_8_ - local_40._8_8_);
      }
    }
    if ((long *)local_40._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_40._0_8_ + 8))();
    }
  }
  return bVar2;
}

Assistant:

bool ReadFileToString(const std::string &file_name, std::string *contents) {
  if (!contents) {
    return false;
  }
  std::unique_ptr<FileReaderInterface> file_reader =
      FileReaderFactory::OpenReader(file_name);
  if (file_reader == nullptr) {
    return false;
  }
  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return false;
  }
  contents->assign(buffer.begin(), buffer.end());
  return true;
}